

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExpectation.cpp
# Opt level: O0

void __thiscall psy::C::Expectation::Expectation(Expectation *this)

{
  Expectation *this_local;
  
  this->numE_ = 0;
  this->numW_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->descriptorsE_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->descriptorsW_);
  this->continueTestDespiteOfErrors_ = false;
  this->containsAmbiguity_ = false;
  std::__cxx11::string::string((string *)&this->ambiguityText_);
  this->unfinishedParse_ = false;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector(&this->syntaxKinds_);
  std::vector<psy::C::Decl,_std::allocator<psy::C::Decl>_>::vector(&this->declarations_);
  this->checkScope_ = false;
  std::vector<int,_std::allocator<int>_>::vector(&this->scopePath_);
  return;
}

Assistant:

Expectation::Expectation()
    : numE_(0)
    , numW_(0)
    , continueTestDespiteOfErrors_(false)
    , containsAmbiguity_(false)
    , unfinishedParse_(false)
    , checkScope_(false)
{}